

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_false,_false>::solve_(DaTrie<false,_false,_false> *this,Query *query)

{
  uint8_t *puVar1;
  byte bVar2;
  pointer pBVar3;
  uint32_t base;
  Edge *edge;
  uint32_t node_pos;
  uint uVar4;
  long lVar5;
  Edge edges [2];
  Edge local_248;
  Edge local_140;
  
  edge = &local_248;
  lVar5 = 0;
  do {
    puVar1 = local_248.labels_ + lVar5;
    lVar5 = lVar5 + 0x108;
    memset(puVar1,0,0x108);
  } while (lVar5 != 0x210);
  edge_(this,query->node_pos_,&local_248,0x100);
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = *(uint *)(pBVar3 + query->node_pos_) & 0x7fffffff;
  bVar2 = query->key_[query->pos_];
  node_pos = 0;
  if (uVar4 != bVar2) {
    node_pos = *(uint *)&pBVar3[uVar4 ^ bVar2].field_0x4 & 0x7fffffff;
    edge_(this,node_pos,&local_140,0x100);
  }
  if ((uVar4 == bVar2) || (local_248.size_ < local_140.size_)) {
    puVar1 = local_248.labels_ + local_248.size_;
    local_248.size_ = local_248.size_ + 1;
    *puVar1 = query->key_[query->pos_];
    base = xcheck_(this,&local_248,&this->blocks_);
    local_248.size_ = local_248.size_ - 1;
    node_pos = query->node_pos_;
  }
  else {
    edge = &local_140;
    base = xcheck_(this,edge,&this->blocks_);
  }
  move_(this,node_pos,base,edge,query);
  return;
}

Assistant:

void solve_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edges[2] = {};
    edge_(query.node_pos(), edges[0]);

    uint32_t _node_pos = 0;
    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (child_pos != 0) {
      _node_pos = bc_[child_pos].check();
      edge_(_node_pos, edges[1]);
    }

    if (child_pos == 0 || edges[0].size() < edges[1].size()) {
      edges[0].push(query.label());
      auto base = xcheck_(edges[0], blocks_);
      edges[0].pop();
      move_(query.node_pos(), base, edges[0], query);
    } else {
      auto base = xcheck_(edges[1], blocks_);
      move_(_node_pos, base, edges[1], query);
    }
  }